

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

void AddBit(int bit,uchar *bp,uchar **out,size_t *outsize)

{
  ulong uVar1;
  uchar *puVar2;
  
  if (*bp == '\0') {
    uVar1 = *outsize;
    if ((uVar1 & uVar1 - 1) == 0) {
      if (uVar1 == 0) {
        puVar2 = (uchar *)malloc(1);
      }
      else {
        puVar2 = (uchar *)realloc(*out,uVar1 * 2);
      }
      *out = puVar2;
    }
    (*out)[*outsize] = '\0';
    *outsize = *outsize + 1;
  }
  (*out)[*outsize - 1] = (*out)[*outsize - 1] | (byte)(bit << (*bp & 0x1f));
  *bp = *bp + 1 & 7;
  return;
}

Assistant:

static void AddBit(int bit,
                   unsigned char* bp, unsigned char** out, size_t* outsize) {
  if (*bp == 0) ZOPFLI_APPEND_DATA(0, out, outsize);
  (*out)[*outsize - 1] |= bit << *bp;
  *bp = (*bp + 1) & 7;
}